

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O0

Result * __thiscall
CoreML::OneHotEncoder::getFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<long,_std::allocator<long>_> *container)

{
  int iVar1;
  OneHotEncoder *this_00;
  int iVar2;
  element_type *this_01;
  Int64Vector *pIVar3;
  int64_t local_38;
  int local_2c;
  OneHotEncoder *pOStack_28;
  int i;
  OneHotEncoder *ohe;
  vector<long,_std::allocator<long>_> *container_local;
  OneHotEncoder *this_local;
  
  ohe = (OneHotEncoder *)container;
  container_local = (vector<long,_std::allocator<long>_> *)this;
  this_local = (OneHotEncoder *)__return_storage_ptr__;
  this_01 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  pOStack_28 = Specification::Model::mutable_onehotencoder(this_01);
  local_2c = 0;
  while( true ) {
    iVar1 = local_2c;
    pIVar3 = Specification::OneHotEncoder::int64categories(pOStack_28);
    iVar2 = Specification::Int64Vector::vector_size(pIVar3);
    this_00 = ohe;
    if (iVar2 <= iVar1) break;
    pIVar3 = Specification::OneHotEncoder::int64categories(pOStack_28);
    local_38 = Specification::Int64Vector::vector(pIVar3,local_2c);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)this_00,&local_38);
    local_2c = local_2c + 1;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getFeatureEncoding(std::vector<int64_t>& container) {
        auto *ohe = m_spec->mutable_onehotencoder();
        
        for (int i = 0; i < ohe->int64categories().vector_size(); i++) {
            container.push_back(ohe->int64categories().vector(i));
        }
        return Result();
    }